

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

EnumSchema __thiscall capnp::Type::asEnum(Type *this)

{
  bool bVar1;
  Schema local_80;
  Fault local_78;
  Fault f_1;
  RawBrandedSchema **local_68;
  undefined1 local_60 [8];
  DebugComparison<const_capnp::_::RawBrandedSchema_*const_&,_std::nullptr_t> _kjCondition_1;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Type *this_local;
  
  f.exception._6_1_ = isEnum(this);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    local_68 = (RawBrandedSchema **)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&(this->field_4).schema);
    f_1.exception = (Exception *)0x0;
    kj::_::DebugExpression<capnp::_::RawBrandedSchema_const*const&>::operator!=
              ((DebugComparison<const_capnp::_::RawBrandedSchema_*const_&,_std::nullptr_t> *)
               local_60,(DebugExpression<capnp::_::RawBrandedSchema_const*const&> *)&local_68,
               &f_1.exception);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawBrandedSchema_const*const&,decltype(nullptr)>&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x307,FAILED,"schema != nullptr","_kjCondition,",
                 (DebugComparison<const_capnp::_::RawBrandedSchema_*const_&,_std::nullptr_t> *)
                 local_60);
      kj::_::Debug::Fault::fatal(&local_78);
    }
    Schema::Schema(&local_80,(this->field_4).schema);
    EnumSchema::EnumSchema((EnumSchema *)&this_local,local_80);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[47]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x304,FAILED,"isEnum()",
               "_kjCondition,\"Tried to interpret a non-enum type as an enum.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [47])"Tried to interpret a non-enum type as an enum.");
    EnumSchema::EnumSchema((EnumSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  return (EnumSchema)(Schema)this_local;
}

Assistant:

EnumSchema Type::asEnum() const {
  KJ_REQUIRE(isEnum(), "Tried to interpret a non-enum type as an enum.") {
    return EnumSchema();
  }
  KJ_ASSERT(schema != nullptr);
  return EnumSchema(Schema(schema));
}